

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plg.cpp
# Opt level: O1

bool __thiscall rw::PluginList::streamRead(PluginList *this,Stream *stream,void *object)

{
  LinkList *pLVar1;
  LLLink *pLVar2;
  LLLink *pLVar3;
  bool bVar4;
  bool bVar5;
  int32 length;
  ChunkHeaderInfo header;
  uint32 local_44;
  ChunkHeaderInfo local_40;
  
  bVar5 = false;
  bVar4 = findChunk(stream,3,&local_44,(uint32 *)0x0);
  if (bVar4) {
    if (0 < (int)local_44) {
      pLVar1 = &this->plugins;
      do {
        bVar4 = readChunkHeaderInfo(stream,&local_40);
        if (!bVar4) {
          return false;
        }
        local_44 = local_44 - 0xc;
        pLVar2 = (pLVar1->link).next;
        do {
          pLVar3 = pLVar2;
          if (pLVar3 == &pLVar1->link) goto LAB_0010fb68;
          pLVar2 = pLVar3->next;
        } while ((*(uint32 *)&pLVar3[-5].next != local_40.type) ||
                (pLVar3[-3].next == (LLLink *)0x0));
        (*(code *)pLVar3[-3].next)
                  (stream,local_40.length,object,*(undefined4 *)&pLVar3[-6].prev,
                   *(undefined4 *)((long)&pLVar3[-6].prev + 4));
        if (pLVar3 == &pLVar1->link) {
LAB_0010fb68:
          (*stream->_vptr_Stream[5])(stream,(ulong)local_40.length,1);
        }
        local_44 = local_44 - local_40.length;
      } while (0 < (int)local_44);
    }
    bVar5 = true;
    pLVar2 = (this->plugins).link.next;
    while (pLVar3 = pLVar2, pLVar3 != &(this->plugins).link) {
      pLVar2 = pLVar3->next;
      if (pLVar3[-1].next != (LLLink *)0x0) {
        (*(code *)pLVar3[-1].next)
                  (object,*(undefined4 *)&pLVar3[-6].prev,
                   *(undefined4 *)((long)&pLVar3[-6].prev + 4));
      }
    }
  }
  return bVar5;
}

Assistant:

bool
PluginList::streamRead(Stream *stream, void *object)
{
	int32 length;
	ChunkHeaderInfo header;
	if(!findChunk(stream, ID_EXTENSION, (uint32*)&length, nil))
		return false;
	while(length > 0){
		if(!readChunkHeaderInfo(stream, &header))
			return false;
		length -= 12;
		FORLIST(lnk, this->plugins){
			Plugin *p = PLG(lnk);
			if(p->id == header.type && p->read){
				p->read(stream, header.length,
				        object, p->offset, p->size);
				goto cont;
			}
		}
		stream->seek(header.length);
cont:
		length -= header.length;
	}

	// now the always callbacks
	FORLIST(lnk, this->plugins){
		Plugin *p = PLG(lnk);
		if(p->alwaysCallback)
			p->alwaysCallback(object, p->offset, p->size);
	}
	return true;
}